

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::InitScanFiles(cmQtAutoGenInitializer *this)

{
  pointer *pppcVar1;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pAVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pbVar5;
  iterator iVar6;
  pointer puVar7;
  pointer ppMVar8;
  pointer ppcVar9;
  cmMakefile *pcVar10;
  size_t __n;
  pointer pcVar11;
  string_view suffix;
  FileExtensions *pFVar12;
  size_type sVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  byte bVar17;
  int iVar18;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *pvVar19;
  _Alloc_hider _Var20;
  string *psVar21;
  const_iterator cVar22;
  const_iterator cVar23;
  undefined7 extraout_var;
  string *psVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  pointer pbVar26;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID PVar27;
  PolicyID extraout_EDX_02;
  PolicyID extraout_EDX_03;
  PolicyID extraout_EDX_04;
  _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var28;
  pointer puVar29;
  long lVar30;
  iterator __begin3;
  pointer ppMVar31;
  pointer ppcVar32;
  char cVar33;
  _Alloc_hider __ptr;
  char *pcVar34;
  undefined1 rcc;
  _Alloc_hider in_R8;
  Qrc *qrc_1;
  pointer pQVar35;
  iterator __end4;
  pointer pAVar36;
  long lVar37;
  iterator __begin3_1;
  pointer pQVar38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  string *this_01;
  pointer pQVar39;
  pointer pQVar40;
  bool bVar41;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  string_view arg_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_13;
  string_view prefix;
  string_view filename;
  string_view text;
  string_view text_00;
  string_view prefix_00;
  string_view arg_01;
  string_view suffix_00;
  string suffixedPath;
  string basePath;
  string fullPath;
  ConfigString uiHeader;
  cmSourceFile *sf_1;
  string uiHeaderGenex;
  cmSourceFile *sf;
  string uiHeaderFilePath;
  anon_class_16_2_e88080e7 makeMUFile;
  string local_390;
  string local_370;
  string local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_328;
  undefined1 local_320 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_300;
  undefined1 local_2c8 [32];
  cmQtAutoGenGlobalInitializer *local_2a8;
  string *local_2a0;
  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_298;
  _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_290;
  string *local_288;
  cmake *local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined1 local_248 [16];
  undefined1 local_238 [24];
  char *local_220;
  _Prime_rehash_policy local_218;
  _Alloc_hider local_208;
  cmSourceFile *local_200;
  _Alloc_hider *local_1f8;
  undefined1 local_1f0 [8];
  _Alloc_hider local_1e8;
  _Alloc_hider local_1e0;
  char **local_1d8;
  char *local_1d0;
  char *local_1c8;
  _Alloc_hider local_1c0;
  char **local_1b8;
  char *local_1b0;
  char *local_1a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  __node_base local_190;
  size_type local_188;
  _Prime_rehash_policy _Stack_180;
  __node_base_ptr local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_168;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  undefined2 local_140;
  undefined1 local_138 [24];
  _Alloc_hider _Stack_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_110;
  _Alloc_hider local_100;
  string *local_f8;
  undefined1 local_f0 [8];
  string local_e8;
  undefined1 local_c8 [16];
  string local_b8;
  _Alloc_hider local_98;
  pointer local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pointer local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_280 = cmMakefile::GetCMakeInstance(this->Makefile);
  local_2a8 = this->GlobalInitializer;
  local_c8._8_8_ = &local_2a8->Keywords_;
  local_c8._0_8_ = this;
  pvVar19 = cmGeneratorTarget::GetAllConfigSources(this->GenTarget);
  pAVar36 = (pvVar19->
            super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (pvVar19->
           super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar36 != pAVar3) {
    pFVar12 = &local_280->HeaderFileExtensions;
    local_100._M_p = (pointer)&(this->AutogenTarget).CMP0100HeadersWarn;
    local_2a0 = (string *)&(this->AutogenTarget).FilesGenerated;
    local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(this->AutogenTarget).Headers;
    local_328 = &(local_280->CLikeSourceFileExtensions).unordered._M_h;
    local_298 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 *)&(this->AutogenTarget).Sources;
    local_290 = (_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&(local_2a8->Keywords_).SKIP_AUTOGEN;
    local_288 = &(local_2a8->Keywords_).SKIP_AUTORCC;
    in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&(local_2a8->Keywords_).AUTORCC_OPTIONS;
    local_f8 = (string *)&(this->Rcc).Qrcs;
    local_f0 = (undefined1  [8])in_RCX;
    do {
      _Var20._M_p = (pointer)cmSourceFile::GetFullPath_abi_cxx11_(pAVar36->Source);
      psVar21 = cmSourceFile::GetExtension_abi_cxx11_(pAVar36->Source);
      cmsys::SystemTools::LowerCase((string *)local_320,psVar21);
      if (((this->Moc).super_GenVarsT.Enabled != false) ||
         (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
        local_258._M_allocated_capacity = local_320._8_8_;
        local_258._8_8_ = local_320._0_8_;
        cVar22 = std::
                 _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(&(pFVar12->unordered)._M_h,(key_type *)&local_258);
        if (cVar22.
            super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
            _M_cur == (__node_type *)0x0) {
          local_258._M_allocated_capacity = local_320._8_8_;
          local_258._8_8_ = local_320._0_8_;
          in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_320._8_8_;
          cVar22 = std::
                   _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(local_328,(key_type *)&local_258);
          if (cVar22.
              super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            in_R8._M_p = (pointer)&pAVar36->Configs;
            InitScanFiles::anon_class_16_2_e88080e7::operator()
                      ((anon_class_16_2_e88080e7 *)&local_370,(cmSourceFile *)local_c8,
                       (string *)pAVar36->Source,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)_Var20._M_p,
                       SUB81(in_R8._M_p,0));
            if (((local_370._M_dataplus._M_p[0x43] != '\0') ||
                ((char)*(short *)(local_370._M_dataplus._M_p + 0x44) == '\x01')) &&
               (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_370._M_dataplus._M_p + 0x40))->_M_local_buf[0] == '\x01')) {
              local_258._M_allocated_capacity = (size_type)local_370._M_dataplus._M_p;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                        ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                          *)local_2a0,(MUFile **)&local_258._M_allocated_capacity);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      (local_298,
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_370._M_dataplus._M_p + 0x20),&local_370);
            in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var20._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              psVar21 = &local_370;
              __ptr._M_p = local_370._M_dataplus._M_p;
              goto LAB_002bc841;
            }
          }
        }
        else {
          InitScanFiles::anon_class_16_2_e88080e7::operator()
                    ((anon_class_16_2_e88080e7 *)&local_390,(cmSourceFile *)local_c8,
                     (string *)pAVar36->Source,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)_Var20._M_p,
                     (bool)((char)pAVar36 + '\x10'));
          local_258._M_allocated_capacity =
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_390._M_dataplus._M_p + 0x20))->_M_allocated_capacity;
          cVar33 = '\x01';
          if (local_390._M_dataplus._M_p[0x43] == '\0') {
            cVar33 = (char)*(short *)(local_390._M_dataplus._M_p + 0x44);
          }
          _Var20._M_p = local_390._M_dataplus._M_p;
          if (((this->CMP0100Accept == false) &&
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_320._8_8_ ==
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x2)) && (*(short *)local_320._0_8_ == 0x6868)) {
            in_R8._M_p = (pointer)this;
            if ((cVar33 != '\0') && (_Var20._M_p = (pointer)this, this->CMP0100Warn == true)) {
              iVar6._M_current =
                   (this->AutogenTarget).CMP0100HeadersWarn.
                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->AutogenTarget).CMP0100HeadersWarn.
                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                _M_realloc_insert<cmSourceFile*const&>
                          ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)local_100._M_p,
                           iVar6,(cmSourceFile **)&local_258._M_allocated_capacity);
              }
              else {
                *iVar6._M_current = (cmSourceFile *)local_258._M_allocated_capacity;
                pppcVar1 = &(this->AutogenTarget).CMP0100HeadersWarn.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppcVar1 = *pppcVar1 + 1;
              }
            }
          }
          else {
            in_R8._M_p = (pointer)this;
            if ((cVar33 != '\0') &&
               (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_390._M_dataplus._M_p + 0x40))->_M_local_buf[0] == '\x01')) {
              local_370._M_dataplus._M_p = local_390._M_dataplus._M_p;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                        ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                          *)local_2a0,(MUFile **)&local_370);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_330,&local_258,&local_390);
          }
          in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)_Var20._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            psVar21 = &local_390;
            __ptr._M_p = local_390._M_dataplus._M_p;
LAB_002bc841:
            std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                      ((default_delete<cmQtAutoGenInitializer::MUFile> *)psVar21,
                       (MUFile *)__ptr._M_p);
            in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var20._M_p;
          }
        }
      }
      if (((((this->Rcc).super_GenVarsT.Enabled == true) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2a8->Keywords_).qrc._M_string_length)) &&
          (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0 ||
           (iVar18 = bcmp((void *)local_320._0_8_,(local_2a8->Keywords_).qrc._M_dataplus._M_p,
                          local_320._8_8_), iVar18 == 0)))) &&
         ((bVar16 = cmSourceFile::GetPropertyAsBool(pAVar36->Source,(string *)local_290), !bVar16 &&
          (bVar16 = cmSourceFile::GetPropertyAsBool(pAVar36->Source,local_288), !bVar16)))) {
        local_258._M_allocated_capacity = (size_type)local_248;
        local_258._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_248._0_8_ = local_248._0_8_ & 0xffffffffffffff00;
        local_238._0_8_ = local_238 + 0x10;
        local_238._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
        local_218._0_8_ = &local_208;
        local_218._M_next_resize = 0;
        local_208._M_p = local_208._M_p & 0xffffffffffffff00;
        local_1f8 = &local_1e8;
        local_1f0 = (undefined1  [8])0x0;
        local_1e8._M_p = local_1e8._M_p & 0xffffffffffffff00;
        local_1d8 = &local_1c8;
        local_1d0 = (char *)0x0;
        local_1c8 = (char *)((ulong)local_1c8 & 0xffffffffffffff00);
        local_1b8 = local_1a8;
        local_1b0 = (char *)0x0;
        local_1a8[0]._0_1_ = '\0';
        in_RCX = &aStack_168;
        local_190._M_nxt = (_Hash_node_base *)0x1;
        local_188 = 0;
        _Stack_180._M_max_load_factor = 0.0;
        _Stack_180._4_4_ = 0;
        _Stack_180._M_next_resize._0_4_ = 0x3f800000;
        local_170 = (__node_base_ptr)0x0;
        aStack_168._M_allocated_capacity = 0;
        aStack_168._8_8_ = &local_150;
        local_158 = 0;
        local_150._M_local_buf[0] = '\0';
        local_140 = 0;
        local_118 = 0;
        aStack_110._M_allocated_capacity = 0;
        local_138._16_8_ = (pointer)0x0;
        _Stack_120._M_p = (pointer)0x0;
        local_138._0_8_ = (pointer)0x0;
        local_138._8_8_ = (pointer)0x0;
        local_198 = in_RCX;
        std::__cxx11::string::_M_assign((string *)local_238);
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_370,(string *)local_238);
        std::__cxx11::string::operator=((string *)&local_218,(string *)&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,
                          CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                   local_370.field_2._M_local_buf[0]) + 1);
        }
        bVar16 = cmSourceFile::GetIsGenerated(pAVar36->Source,GlobalAndLocal);
        local_140 = CONCAT11(local_140._1_1_,bVar16);
        psVar21 = cmSourceFile::GetSafeProperty(pAVar36->Source,(string *)local_f0);
        if (psVar21->_M_string_length != 0) {
          in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
          arg_01._M_str = (psVar21->_M_dataplus)._M_p;
          arg_01._M_len = psVar21->_M_string_length;
          cmExpandList(arg_01,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_138,false);
        }
        std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
        emplace_back<cmQtAutoGenInitializer::Qrc>
                  ((vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                    *)local_f8,(Qrc *)&local_258);
        Qrc::~Qrc((Qrc *)&local_258);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_320 + 0x10)) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      pAVar36 = pAVar36 + 1;
    } while (pAVar36 != pAVar3);
  }
  cmGeneratorTarget::ClearSourcesCache(this->GenTarget);
  bVar17 = (this->Moc).super_GenVarsT.Enabled;
  bVar16 = (this->Uic).super_GenVarsT.Enabled;
  paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar16);
  if ((((bVar16 | bVar17) & 1) != 0) &&
     (psVar21 = (string *)(this->AutogenTarget).Sources._M_h._M_before_begin._M_nxt,
     psVar21 != (string *)0x0)) {
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_320 + 0x10);
    this_00 = &(this->AutogenTarget).Headers;
    local_2a0 = (string *)&(this->AutogenTarget).CMP0100HeadersWarn;
    local_298 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 *)&(this->AutogenTarget).FilesGenerated;
    do {
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(psVar21->field_2)._M_allocated_capacity;
      if ((*(undefined1 *)((long)(&paVar4->_M_allocated_capacity + 8) + 3) != '\0') ||
         (*(char *)((long)(&paVar4->_M_allocated_capacity + 8) + 4) == '\x01')) {
        local_330 = paVar4;
        local_288 = psVar21;
        local_328 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)cmSourceFile::ResolveFullPath
                                 ((cmSourceFile *)
                                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)(&paVar4->_M_allocated_capacity + 4))->_M_allocated_capacity,
                                  (string *)0x0,(string *)0x0);
        filename._M_str = (char *)paVar25;
        filename._M_len = (size_t)(((string *)local_328)->_M_dataplus)._M_p;
        cmQtAutoGen::SubDirPrefix_abi_cxx11_
                  ((string *)local_320,(cmQtAutoGen *)((string *)local_328)->_M_string_length,
                   filename);
        uVar15 = local_320._8_8_;
        uVar14 = local_320._0_8_;
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_390,(string *)local_328);
        local_258._M_allocated_capacity = uVar15;
        local_258._8_8_ = uVar14;
        local_248._0_8_ = local_390._M_string_length;
        local_248._8_8_ = local_390._M_dataplus._M_p;
        views._M_len = 2;
        views._M_array = (iterator)&local_258;
        cmCatViews_abi_cxx11_(&local_370,views);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._0_8_ != paVar2) {
          operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
        }
        local_328 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)(local_330->_M_local_buf + 0x28);
        p_Var28 = (_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)0x0;
        do {
          local_248._0_8_ = p_Var28[0x2a8bf]._M_element_count;
          local_248._8_8_ = *(undefined8 *)&p_Var28[0x2a8bf]._M_rehash_policy;
          local_258._M_allocated_capacity = local_370._M_string_length;
          local_258._8_8_ = local_370._M_dataplus._M_p;
          views_00._M_len = 2;
          views_00._M_array = (iterator)&local_258;
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_370._M_string_length;
          cmCatViews_abi_cxx11_(&local_390,views_00);
          pbVar5 = *(pointer *)
                    ((long)&(local_280->HeaderFileExtensions).ordered.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data + 8);
          local_290 = p_Var28;
          for (pbVar26 = (local_280->HeaderFileExtensions).ordered.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar26 != pbVar5;
              pbVar26 = pbVar26 + 1) {
            local_320._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            local_320[0x10] = 0x2e;
            local_258._M_allocated_capacity = local_390._M_string_length;
            local_258._8_8_ = local_390._M_dataplus._M_p;
            local_248._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            local_238._8_8_ = (pbVar26->_M_dataplus)._M_p;
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pbVar26->_M_string_length;
            views_01._M_len = 3;
            views_01._M_array = (iterator)&local_258;
            local_320._8_8_ = paVar2;
            local_248._8_8_ = paVar2;
            local_238._0_8_ = paVar25;
            cmCatViews_abi_cxx11_(&local_350,views_01);
            local_2c8._0_8_ = cmMakefile::GetSource(this->Makefile,&local_350,Known);
            if ((cmSourceFile *)local_2c8._0_8_ == (cmSourceFile *)0x0) {
              bVar16 = cmsys::SystemTools::FileExists(&local_350);
              if (bVar16) {
                paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x1;
                local_2c8._0_8_ = cmMakefile::CreateSource(this->Makefile,&local_350,false,Known);
              }
LAB_002bce1c:
              if ((cmSourceFile *)local_2c8._0_8_ != (cmSourceFile *)0x0) {
LAB_002bce25:
                InitScanFiles::anon_class_16_2_e88080e7::operator()
                          ((anon_class_16_2_e88080e7 *)(local_f0 + 8),(cmSourceFile *)local_c8,
                           (string *)local_2c8._0_8_,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_350,
                           SUB81(local_328,0));
                if (local_330->_M_local_buf[0x43] == '\0') {
                  *(undefined1 *)((long)local_e8._M_dataplus._M_p + 0x43) = 0;
                }
                if ((char)*(short *)(local_330->_M_local_buf + 0x44) == '\0') {
                  *(undefined1 *)((long)local_e8._M_dataplus._M_p + 0x44) = 0;
                }
                paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)local_e8._M_dataplus._M_p + 0x20))->_M_allocated_capacity;
                cVar33 = '\x01';
                if (*(char *)((long)local_e8._M_dataplus._M_p + 0x43) == '\0') {
                  cVar33 = *(char *)((long)local_e8._M_dataplus._M_p + 0x44);
                }
                local_258._M_allocated_capacity = (size_type)paVar25;
                if (((this->CMP0100Accept == false) && (pbVar26->_M_string_length == 2)) &&
                   (*(short *)(pbVar26->_M_dataplus)._M_p == 0x6868)) {
                  in_R8._M_p = (pointer)this;
                  if ((cVar33 != '\0') && (this->CMP0100Warn == true)) {
                    iVar6._M_current =
                         (this->AutogenTarget).CMP0100HeadersWarn.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
                    if (iVar6._M_current ==
                        (this->AutogenTarget).CMP0100HeadersWarn.
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                      _M_realloc_insert<cmSourceFile*const&>
                                ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)local_2a0,
                                 iVar6,(cmSourceFile **)&local_258._M_allocated_capacity);
                    }
                    else {
                      *iVar6._M_current = (cmSourceFile *)paVar25;
                      pppcVar1 = &(this->AutogenTarget).CMP0100HeadersWarn.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                      *pppcVar1 = *pppcVar1 + 1;
                    }
                  }
                }
                else {
                  in_R8._M_p = (pointer)this;
                  if ((cVar33 != '\0') &&
                     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((long)local_e8._M_dataplus._M_p + 0x40))->_M_local_buf[0] == '\x01')) {
                    local_320._0_8_ = local_e8._M_dataplus._M_p;
                    std::
                    vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                    ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                              ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                                *)local_298,(MUFile **)local_320);
                  }
                  std::
                  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::
                  _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                            ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)this_00,&local_258,local_f0 + 8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                            ((default_delete<cmQtAutoGenInitializer::MUFile> *)(local_f0 + 8),
                             (MUFile *)local_e8._M_dataplus._M_p);
                }
              }
            }
            else {
              cVar23 = std::
                       _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(&this_00->_M_h,(key_type *)local_2c8);
              if (cVar23.
                  super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
                bVar16 = cmSourceFile::GetIsGenerated
                                   ((cmSourceFile *)local_2c8._0_8_,GlobalAndLocal);
                if (bVar16) goto LAB_002bce1c;
                bVar16 = cmsys::SystemTools::FileExists(&local_350);
                paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(CONCAT71(extraout_var,bVar16) & 0xffffffff);
                if (((byte)paVar25 & (cmSourceFile *)local_2c8._0_8_ != (cmSourceFile *)0x0) == 0)
                goto LAB_002bcf0a;
                goto LAB_002bce25;
              }
            }
LAB_002bcf0a:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != &local_350.field_2) {
              operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
          p_Var28 = (_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_290->_M_before_begin;
        } while (p_Var28 !=
                 (_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)0x20);
        psVar21 = local_288;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,
                          CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                   local_370.field_2._M_local_buf[0]) + 1);
          psVar21 = local_288;
        }
      }
      psVar21 = *(string **)&((_Rep_type *)&psVar21->_M_dataplus)->_M_impl;
    } while (psVar21 != (string *)0x0);
    bVar17 = (this->Moc).super_GenVarsT.Enabled;
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ulong)(this->Uic).super_GenVarsT.Enabled;
  }
  if (((bVar17 | (byte)paVar25) & 1) != 0) {
    puVar29 = (this->Makefile->SourceFiles).
              super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (this->Makefile->SourceFiles).
             super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar29 != puVar7) {
      local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(local_280->HeaderFileExtensions).unordered;
      local_328 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&(this->AutogenTarget).Headers;
      local_88._M_allocated_capacity = (size_type)&(this->AutogenTarget).CMP0100HeadersWarn;
      local_298 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   *)&(this->AutogenTarget).FilesGenerated;
      local_280 = (cmake *)&(local_280->CLikeSourceFileExtensions).unordered;
      local_290 = &(this->AutogenTarget).Sources._M_h;
      local_2a0 = &(local_2a8->Keywords_).SKIP_AUTOGEN;
      local_f0 = (undefined1  [8])&(local_2a8->Keywords_).SKIP_AUTOUIC;
      local_f8 = &(local_2a8->Keywords_).AUTOUIC_OPTIONS;
      local_88._8_8_ = &(this->Uic).UiFilesWithOptions;
      local_90 = (pointer)&(this->Uic).UiFilesNoOptions;
      local_100._M_p = (pointer)&(this->Uic).UiHeaders;
      local_288 = (string *)&(this->Uic).SkipUi;
      do {
        local_370._M_string_length = 0;
        local_370.field_2._M_local_buf[0] = '\0';
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        psVar21 = cmSourceFile::ResolveFullPath
                            ((puVar29->_M_t).
                             super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                             .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,&local_370,
                             (string *)0x0);
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_370._M_string_length ==
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) && (psVar21->_M_string_length != 0)) {
          psVar24 = cmSourceFile::GetExtension_abi_cxx11_
                              ((puVar29->_M_t).
                               super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                               .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl);
          cmsys::SystemTools::LowerCase(&local_390,psVar24);
          local_258._M_allocated_capacity = local_390._M_string_length;
          local_258._8_8_ = local_390._M_dataplus._M_p;
          cVar22 = std::
                   _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_330,(key_type *)&local_258);
          bVar16 = SUB81(&local_258,0);
          if (cVar22.
              super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_258._M_allocated_capacity = local_390._M_string_length;
            local_258._8_8_ = local_390._M_dataplus._M_p;
            cVar22 = std::
                     _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_280,(key_type *)&local_258);
            if (cVar22.
                super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              if ((((this->Uic).super_GenVarsT.Enabled == true) &&
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_390._M_string_length ==
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_2a8->Keywords_).ui._M_string_length)) &&
                 (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_390._M_string_length ==
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0 ||
                  (iVar18 = bcmp(local_390._M_dataplus._M_p,
                                 (local_2a8->Keywords_).ui._M_dataplus._M_p,
                                 local_390._M_string_length), iVar18 == 0)))) {
                bVar16 = cmSourceFile::GetPropertyAsBool
                                   ((puVar29->_M_t).
                                    super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                                    .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                                    local_2a0);
                if ((bVar16) ||
                   (bVar16 = cmSourceFile::GetPropertyAsBool
                                       ((puVar29->_M_t).
                                        super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                                        .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                                        (string *)local_f0), bVar16)) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_288,psVar21);
                }
                else {
                  psVar24 = cmSourceFile::GetSafeProperty
                                      ((puVar29->_M_t).
                                       super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                                       .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                                       local_f8);
                  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
                  pcVar11 = (psVar24->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_350,pcVar11,pcVar11 + psVar24->_M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_350._M_string_length ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string_const&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               local_90,psVar21);
                  }
                  else {
                    arg._M_str = local_350._M_dataplus._M_p;
                    arg._M_len = local_350._M_string_length;
                    cmExpandedList_abi_cxx11_
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_258,arg,false);
                    std::
                    vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    ::
                    emplace_back<std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              ((vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                *)local_88._8_8_,psVar21,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_258);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_258);
                  }
                  aStack_110._8_8_ =
                       cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(this->LocalGen);
                  cmsys::SystemTools::GetFilenamePath((string *)&local_258,psVar21);
                  cmSystemTools::RelativePath
                            ((string *)local_2c8,(string *)aStack_110._8_8_,(string *)&local_258);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_allocated_capacity !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248) {
                    operator_delete((void *)local_258._M_allocated_capacity,
                                    (ulong)(local_248._0_8_ + 1));
                  }
                  if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
                    pbVar26 = (pointer)0x0;
                  }
                  else {
                    pbVar26 = (pointer)local_2c8._8_8_;
                    if (((char *)(local_2c8._0_8_ + -1))[local_2c8._8_8_] != '/') {
                      std::__cxx11::string::push_back((char)local_2c8);
                      pbVar26 = (pointer)local_2c8._8_8_;
                    }
                  }
                  local_320._0_8_ = (pointer)0x1;
                  local_320._8_8_ = local_320 + 0x10;
                  local_320[0x10] = 0x2f;
                  aStack_110._8_8_ = local_2c8._0_8_;
                  local_98._M_p = (pointer)pbVar26;
                  cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&local_278,psVar21);
                  local_258._M_allocated_capacity = local_320._0_8_;
                  local_258._8_8_ = local_320._8_8_;
                  local_248._0_8_ = local_98._M_p;
                  local_248._8_8_ = aStack_110._8_8_;
                  local_238._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x3;
                  local_238._8_8_ = "ui_";
                  local_238._16_8_ = local_278._8_8_;
                  local_220 = (char *)local_278._M_allocated_capacity;
                  local_218._0_8_ = (_Alloc_hider *)0x2;
                  local_218._M_next_resize = 0x78d9e3;
                  views_02._M_len = 5;
                  views_02._M_array = (iterator)&local_258;
                  cmCatViews_abi_cxx11_((string *)(local_f0 + 8),views_02);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_allocated_capacity != &local_268) {
                    operator_delete((void *)local_278._M_allocated_capacity,
                                    CONCAT71(local_268._M_allocated_capacity._1_7_,
                                             local_268._M_local_buf[0]) + 1);
                  }
                  local_320._0_8_ = local_320 + 0x10;
                  local_320._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_320._16_8_ = local_320._16_8_ & 0xffffffffffffff00;
                  local_300._M_buckets = &local_300._M_single_bucket;
                  local_300._M_bucket_count = 1;
                  local_300._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                  local_300._M_element_count = 0;
                  local_300._M_rehash_policy._M_max_load_factor = 1.0;
                  local_300._M_rehash_policy._M_next_resize = 0;
                  local_300._M_single_bucket = (__node_base_ptr)0x0;
                  local_278._M_allocated_capacity = (size_type)&local_268;
                  local_278._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_268._M_local_buf[0] = '\0';
                  local_258._8_8_ = (this->Dir).Build._M_dataplus._M_p;
                  local_258._M_allocated_capacity = (this->Dir).Build._M_string_length;
                  local_248._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x8;
                  local_248._8_8_ = (long)"/usr/include" + 4;
                  views_03._M_len = 2;
                  views_03._M_array = (iterator)&local_258;
                  cmCatViews_abi_cxx11_(&local_b8,views_03);
                  local_58 = (pointer)local_e8._M_string_length;
                  paStack_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)local_e8._M_dataplus._M_p;
                  suffix._M_str = local_e8._M_dataplus._M_p;
                  suffix._M_len = local_e8._M_string_length;
                  prefix._M_str = local_b8._M_dataplus._M_p;
                  prefix._M_len = local_b8._M_string_length;
                  in_R8._M_p = local_b8._M_dataplus._M_p;
                  ConfigFileNamesAndGenex
                            (this,(ConfigString *)local_320,(string *)&local_278,prefix,suffix);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._0_8_ + 1);
                  }
                  std::
                  pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  pair<cmQtAutoGenInitializer::ConfigString_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                            ((pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_258,(ConfigString *)local_320,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_278);
                  std::
                  vector<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>,std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>>
                  ::
                  emplace_back<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>
                            ((vector<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>,std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>>
                              *)local_100._M_p,
                             (pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_258);
                  if (local_200 != (cmSourceFile *)local_1f0) {
                    operator_delete(local_200,
                                    (ulong)((long)&(((
                                                  deque<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)local_1f0)->
                                                  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )._M_impl + 1));
                  }
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_238);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_allocated_capacity !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248) {
                    operator_delete((void *)local_258._M_allocated_capacity,
                                    (ulong)(local_248._0_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_allocated_capacity != &local_268) {
                    operator_delete((void *)local_278._M_allocated_capacity,
                                    CONCAT71(local_268._M_allocated_capacity._1_7_,
                                             local_268._M_local_buf[0]) + 1);
                  }
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::~_Hashtable(&local_300);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_320._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_320 + 0x10)) {
                    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,(ulong)(local_e8.field_2._0_8_ + 1));
                  }
                  if ((cmSourceFile *)local_2c8._0_8_ != (cmSourceFile *)(local_2c8 + 0x10)) {
                    operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_350._M_dataplus._M_p != &local_350.field_2) {
                    operator_delete(local_350._M_dataplus._M_p,
                                    local_350.field_2._M_allocated_capacity + 1);
                  }
                }
              }
            }
            else {
              local_258._M_allocated_capacity =
                   (size_type)
                   (puVar29->_M_t).
                   super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
                   super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                   super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl;
              cVar23 = std::
                       _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(local_290,(key_type *)&local_258._M_allocated_capacity);
              if (cVar23.
                  super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
                local_258._M_allocated_capacity = 0;
                local_258._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_248._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                in_R8._M_p = (pointer)&local_258;
                InitScanFiles::anon_class_16_2_e88080e7::operator()
                          ((anon_class_16_2_e88080e7 *)local_320,(cmSourceFile *)local_c8,
                           (string *)
                           (puVar29->_M_t).
                           super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                           .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)psVar21,bVar16);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_allocated_capacity !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete((void *)local_258._M_allocated_capacity,
                                  local_248._0_8_ - local_258._0_8_);
                }
                if ((*(char *)(local_320._0_8_ + 0x41) != '\0') ||
                   ((char)*(short *)(local_320._0_8_ + 0x42) == '\x01')) {
                  if (((*(char *)(local_320._0_8_ + 0x43) != '\0') ||
                      ((char)*(short *)(local_320._0_8_ + 0x44) == '\x01')) &&
                     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_320._0_8_ + 0x40))->_M_local_buf[0] == '\x01')) {
                    local_258._M_allocated_capacity = local_320._0_8_;
                    std::
                    vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                    ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                              ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                                *)local_298,(MUFile **)&local_258._M_allocated_capacity);
                  }
                  std::
                  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::
                  _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                            ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)local_290,
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(local_320._0_8_ + 0x20),local_320);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_320._0_8_ ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) goto LAB_002bd453;
                }
                psVar21 = (string *)local_320;
                _Var20._M_p = (pointer)local_320._0_8_;
                goto LAB_002bd3c7;
              }
            }
          }
          else {
            local_258._M_allocated_capacity =
                 (size_type)
                 (puVar29->_M_t).
                 super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
                 super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                 super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl;
            cVar23 = std::
                     _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)local_328,(key_type *)&local_258._M_allocated_capacity);
            if (cVar23.
                super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              local_258._M_allocated_capacity = 0;
              local_258._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_248._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              in_R8._M_p = (pointer)&local_258;
              InitScanFiles::anon_class_16_2_e88080e7::operator()
                        ((anon_class_16_2_e88080e7 *)&local_350,(cmSourceFile *)local_c8,
                         (string *)
                         (puVar29->_M_t).
                         super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                         super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)psVar21,bVar16);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_allocated_capacity !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete((void *)local_258._M_allocated_capacity,
                                local_248._0_8_ - local_258._0_8_);
              }
              if ((local_350._M_dataplus._M_p[0x41] != '\0') ||
                 ((char)*(short *)(local_350._M_dataplus._M_p + 0x42) == '\x01')) {
                local_258._M_allocated_capacity =
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_350._M_dataplus._M_p + 0x20))->_M_allocated_capacity;
                cVar33 = '\x01';
                if (local_350._M_dataplus._M_p[0x43] == '\0') {
                  cVar33 = (char)*(short *)(local_350._M_dataplus._M_p + 0x44);
                }
                if (((this->CMP0100Accept == false) &&
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_390._M_string_length ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x2)) && (*(short *)local_390._M_dataplus._M_p == 0x6868)) {
                  in_R8._M_p = (pointer)this;
                  if ((cVar33 != '\0') && (this->CMP0100Warn == true)) {
                    iVar6._M_current =
                         (this->AutogenTarget).CMP0100HeadersWarn.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
                    if (iVar6._M_current ==
                        (this->AutogenTarget).CMP0100HeadersWarn.
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                      _M_realloc_insert<cmSourceFile*const&>
                                ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                                 local_88._0_8_,iVar6,
                                 (cmSourceFile **)&local_258._M_allocated_capacity);
                    }
                    else {
                      *iVar6._M_current = (cmSourceFile *)local_258._M_allocated_capacity;
                      pppcVar1 = &(this->AutogenTarget).CMP0100HeadersWarn.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                      *pppcVar1 = *pppcVar1 + 1;
                    }
                  }
                }
                else {
                  in_R8._M_p = (pointer)this;
                  if ((cVar33 != '\0') &&
                     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_350._M_dataplus._M_p + 0x40))->_M_local_buf[0] == '\x01')) {
                    local_320._0_8_ = local_350._M_dataplus._M_p;
                    std::
                    vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                    ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                              ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                                *)local_298,(MUFile **)local_320);
                  }
                  std::
                  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::
                  _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                            ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)local_328,&local_258,&local_350);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) goto LAB_002bd453;
              }
              psVar21 = &local_350;
              _Var20._M_p = local_350._M_dataplus._M_p;
LAB_002bd3c7:
              std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                        ((default_delete<cmQtAutoGenInitializer::MUFile> *)psVar21,
                         (MUFile *)_Var20._M_p);
            }
          }
LAB_002bd453:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,
                          CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                   local_370.field_2._M_local_buf[0]) + 1);
        }
        puVar29 = puVar29 + 1;
      } while (puVar29 != puVar7);
      bVar17 = (this->Moc).super_GenVarsT.Enabled;
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ulong)(this->Uic).super_GenVarsT.Enabled;
    }
  }
  if (((bVar17 & 1) != 0) || (((ulong)paVar25 & 1) != 0)) {
    ppMVar31 = (this->AutogenTarget).FilesGenerated.
               super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppMVar8 = (this->AutogenTarget).FilesGenerated.
              super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppMVar31 != ppMVar8) {
      if (this->CMP0071Accept == true) {
        do {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&(this->AutogenTarget).DependFiles,&(*ppMVar31)->FullPath);
          ppMVar31 = ppMVar31 + 1;
        } while (ppMVar31 != ppMVar8);
      }
      else if (this->CMP0071Warn == true) {
        pcVar34 = "SKIP_AUTOMOC";
        bVar16 = ((ulong)paVar25 & 1) != 0;
        if (bVar16) {
          pcVar34 = "SKIP_AUTOGEN";
        }
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)"SKIP_AUTOUIC";
        if (!bVar16) {
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        }
        if ((bVar17 & 1) != 0) {
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar34;
        }
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        local_370._M_string_length = 0;
        local_370.field_2._M_local_buf[0] = '\0';
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_320 + 0x10);
        local_330 = paVar25;
        do {
          text._M_str = (char *)paVar25;
          text._M_len = (size_t)((*ppMVar31)->FullPath)._M_dataplus._M_p;
          cmQtAutoGen::Quoted_abi_cxx11_
                    (&local_350,(cmQtAutoGen *)((*ppMVar31)->FullPath)._M_string_length,text);
          local_258._M_allocated_capacity = 2;
          local_258._8_8_ = (long)"Resource spec file:\n\n  " + 0x15;
          local_248._0_8_ = local_350._M_string_length;
          local_248._8_8_ = local_350._M_dataplus._M_p;
          local_320._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1;
          local_320[0x10] = 10;
          local_238._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1;
          views_04._M_len = 3;
          views_04._M_array = (iterator)&local_258;
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_string_length;
          local_320._8_8_ = paVar2;
          local_238._8_8_ = paVar2;
          cmCatViews_abi_cxx11_(&local_390,views_04);
          std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_390._M_dataplus._M_p);
          PVar27 = extraout_EDX;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
            PVar27 = extraout_EDX_00;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
            PVar27 = extraout_EDX_01;
          }
          ppMVar31 = ppMVar31 + 1;
        } while (ppMVar31 != ppMVar8);
        pcVar10 = this->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_350,(cmPolicies *)0x47,PVar27);
        sVar13 = local_350._M_string_length;
        _Var20._M_p = local_350._M_dataplus._M_p;
        local_320._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
        local_320[0x10] = 10;
        local_320._8_8_ = paVar2;
        cmQtAutoGen::Tools_abi_cxx11_
                  ((string *)local_2c8,(cmQtAutoGen *)(ulong)(this->Moc).super_GenVarsT.Enabled,
                   (this->Uic).super_GenVarsT.Enabled,false,SUB81(in_R8._M_p,0));
        local_258._M_allocated_capacity = sVar13;
        local_258._8_8_ = _Var20._M_p;
        local_248._0_8_ = local_320._0_8_;
        local_248._8_8_ = local_320._8_8_;
        local_238._0_8_ = &DAT_00000044;
        local_238._8_8_ = "For compatibility, CMake is excluding the GENERATED source file(s):\n";
        local_238._16_8_ = local_370._M_string_length;
        local_220 = local_370._M_dataplus._M_p;
        local_218._0_8_ = (_Alloc_hider *)0x13;
        local_218._M_next_resize = 0x75f14a;
        local_208._M_p = (pointer)local_2c8._8_8_;
        local_200 = (cmSourceFile *)local_2c8._0_8_;
        local_1f8 = (_Alloc_hider *)0xaa;
        local_1f0 = (undefined1  [8])0x75f15e;
        local_1e8._M_p = (pointer)0xc;
        local_1e0._M_p = (pointer)local_330;
        local_1d8 = (char **)&DAT_00000028;
        local_1d0 = ":\n  set_property(SOURCE file.h PROPERTY ";
        local_1c8 = (char *)0xc;
        local_1c0._M_p = (pointer)local_330;
        local_1b8 = (char **)0x5;
        local_1b0 = " ON)\n";
        views_05._M_len = 0xb;
        views_05._M_array = (iterator)&local_258;
        cmCatViews_abi_cxx11_(&local_390,views_05);
        cmMakefile::IssueMessage(pcVar10,AUTHOR_WARNING,&local_390);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        if ((cmSourceFile *)local_2c8._0_8_ != (cmSourceFile *)(local_2c8 + 0x10)) {
          operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,
                          CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                   local_370.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  bVar16 = (this->Moc).super_GenVarsT.Enabled;
  bVar41 = (this->Uic).super_GenVarsT.Enabled;
  if (((bVar16 | bVar41) & 1U) != 0) {
    ppcVar32 = (this->AutogenTarget).CMP0100HeadersWarn.
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar9 = (this->AutogenTarget).CMP0100HeadersWarn.
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppcVar32 != ppcVar9) {
      pcVar34 = "SKIP_AUTOMOC";
      bVar41 = (bVar41 & 1U) != 0;
      if (bVar41) {
        pcVar34 = "SKIP_AUTOGEN";
      }
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)"SKIP_AUTOUIC";
      if (!bVar41) {
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      }
      if (bVar16 != false) {
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar34;
      }
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      local_370._M_string_length = 0;
      local_370.field_2._M_local_buf[0] = '\0';
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_320 + 0x10);
      local_330 = paVar25;
      do {
        psVar21 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar32);
        text_00._M_str = (char *)paVar25;
        text_00._M_len = (size_t)(psVar21->_M_dataplus)._M_p;
        cmQtAutoGen::Quoted_abi_cxx11_(&local_350,(cmQtAutoGen *)psVar21->_M_string_length,text_00);
        local_258._M_allocated_capacity = 2;
        local_258._8_8_ = (long)"Resource spec file:\n\n  " + 0x15;
        local_248._0_8_ = local_350._M_string_length;
        local_248._8_8_ = local_350._M_dataplus._M_p;
        local_320._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
        local_320[0x10] = 10;
        local_238._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
        views_06._M_len = 3;
        views_06._M_array = (iterator)&local_258;
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_string_length;
        local_320._8_8_ = paVar2;
        local_238._8_8_ = paVar2;
        cmCatViews_abi_cxx11_(&local_390,views_06);
        std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_390._M_dataplus._M_p);
        PVar27 = extraout_EDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          PVar27 = extraout_EDX_03;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
          PVar27 = extraout_EDX_04;
        }
        rcc = SUB81(in_R8._M_p,0);
        ppcVar32 = ppcVar32 + 1;
      } while (ppcVar32 != ppcVar9);
      pcVar10 = this->Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_350,(cmPolicies *)0x64,PVar27);
      _Var20._M_p = local_350._M_dataplus._M_p;
      local_320._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_320[0x10] = 10;
      local_320._8_8_ = paVar2;
      cmQtAutoGen::Tools_abi_cxx11_
                ((string *)local_2c8,(cmQtAutoGen *)(ulong)(this->Moc).super_GenVarsT.Enabled,
                 (this->Uic).super_GenVarsT.Enabled,false,(bool)rcc);
      local_258._M_allocated_capacity = local_350._M_string_length;
      local_258._8_8_ = _Var20._M_p;
      local_248._0_8_ = local_320._0_8_;
      local_248._8_8_ = local_320._8_8_;
      local_238._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x3a;
      local_238._8_8_ = "For compatibility, CMake is excluding the header file(s):\n";
      local_238._16_8_ = local_370._M_string_length;
      local_220 = local_370._M_dataplus._M_p;
      local_218._0_8_ = (_Alloc_hider *)0x13;
      local_218._M_next_resize = 0x75f14a;
      local_208._M_p = (pointer)local_2c8._8_8_;
      local_200 = (cmSourceFile *)local_2c8._0_8_;
      local_1f8 = (_Alloc_hider *)0xaa;
      local_1f0 = (undefined1  [8])0x75f273;
      local_1e8._M_p = (pointer)0xc;
      local_1e0._M_p = (pointer)local_330;
      local_1d8 = (char **)0x29;
      local_1d0 = ":\n  set_property(SOURCE file.hh PROPERTY ";
      local_1c8 = (char *)0xc;
      local_1c0._M_p = (pointer)local_330;
      local_1b8 = (char **)0x5;
      local_1b0 = " ON)\n";
      views_07._M_len = 0xb;
      views_07._M_array = (iterator)&local_258;
      cmCatViews_abi_cxx11_(&local_390,views_07);
      cmMakefile::IssueMessage(pcVar10,AUTHOR_WARNING,&local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      if ((cmSourceFile *)local_2c8._0_8_ != (cmSourceFile *)(local_2c8 + 0x10)) {
        operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,
                        CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                 local_370.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if ((this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_330._4_4_,(this->QtVersion).Major);
    psVar21 = cmGeneratorTarget::GetSafeProperty
                        (this->GenTarget,&(local_2a8->Keywords_).AUTORCC_OPTIONS);
    arg_00._M_str = (psVar21->_M_dataplus)._M_p;
    arg_00._M_len = psVar21->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_350,arg_00,false);
    pQVar39 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar40 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar39 != pQVar40) {
      lVar30 = 0;
      pQVar35 = pQVar39;
      do {
        pQVar35->Unique = true;
        lVar37 = lVar30;
        pQVar38 = pQVar39;
        do {
          if (((lVar37 != 0) &&
              (__n = (pQVar35->QrcName)._M_string_length, __n == (pQVar38->QrcName)._M_string_length
              )) && ((__n == 0 ||
                     (iVar18 = bcmp((pQVar35->QrcName)._M_dataplus._M_p,
                                    (pQVar38->QrcName)._M_dataplus._M_p,__n), iVar18 == 0)))) {
            pQVar35->Unique = false;
            break;
          }
          pQVar38 = pQVar38 + 1;
          lVar37 = lVar37 + -0x150;
        } while (pQVar38 != pQVar40);
        pQVar35 = pQVar35 + 1;
        lVar30 = lVar30 + 0x150;
      } while (pQVar35 != pQVar40);
      if (pQVar39 != pQVar40) {
        local_328 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&this->PathCheckSum;
        this_01 = (string *)&pQVar39->InfoFile;
        do {
          cmFilePathChecksum::getPart
                    ((string *)&local_258,(cmFilePathChecksum *)local_328,
                     (string *)(this_01 + -0x60),10);
          std::__cxx11::string::operator=(this_01 + -0x20,(string *)local_258._M_local_buf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_allocated_capacity !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248) {
            operator_delete((void *)local_258._M_allocated_capacity,(ulong)(local_248._0_8_ + 1));
          }
          local_258._8_8_ = (this->Dir).Build._M_dataplus._M_p;
          local_258._M_allocated_capacity = (this->Dir).Build._M_string_length;
          local_320._0_8_ = (pointer)0x1;
          local_320._8_8_ = local_320 + 0x10;
          local_320[0x10] = 0x2f;
          local_248._0_8_ = 1;
          local_238._8_8_ = *(undefined8 *)(this_01 + -0x20);
          local_238._0_8_ = *(undefined8 *)(this_01 + -0x18);
          local_238._16_8_ = 5;
          local_220 = "/qrc_";
          local_218._M_next_resize = *(size_t *)(this_01 + -0x40);
          local_218._0_8_ = *(undefined8 *)(this_01 + -0x38);
          local_208._M_p = (pointer)0x4;
          local_200 = (cmSourceFile *)0x7b7fea;
          views_08._M_len = 6;
          views_08._M_array = (iterator)&local_258;
          local_248._8_8_ = local_320._8_8_;
          cmCatViews_abi_cxx11_(&local_370,views_08);
          std::__cxx11::string::operator=(this_01 + 0x78,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,
                            CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                     local_370.field_2._M_local_buf[0]) + 1);
          }
          local_258._8_8_ = (this->Dir).Info._M_dataplus._M_p;
          local_258._M_allocated_capacity = (this->Dir).Info._M_string_length;
          local_248._0_8_ = 9;
          local_248._8_8_ = "/AutoRcc_";
          local_238._8_8_ = *(undefined8 *)(this_01 + -0x40);
          local_238._0_8_ = *(undefined8 *)(this_01 + -0x38);
          local_320._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1;
          local_320._8_8_ = local_320 + 0x10;
          local_320[0x10] = 0x5f;
          local_238._16_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1;
          local_218._M_next_resize = *(size_t *)(this_01 + -0x20);
          local_218._0_8_ = *(undefined8 *)(this_01 + -0x18);
          views_09._M_len = 5;
          views_09._M_array = (iterator)&local_258;
          local_220 = (char *)local_320._8_8_;
          cmCatViews_abi_cxx11_(&local_370,views_09);
          local_258._M_allocated_capacity = local_370._M_string_length;
          local_258._8_8_ = local_370._M_dataplus._M_p;
          local_248._0_8_ = 10;
          local_248._8_8_ = "_Lock.lock";
          views_10._M_len = 2;
          views_10._M_array = (iterator)&local_258;
          cmCatViews_abi_cxx11_((string *)local_320,views_10);
          std::__cxx11::string::operator=(this_01 + -0x80,(string *)local_320);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_320 + 0x10)) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          }
          local_258._M_allocated_capacity = local_370._M_string_length;
          local_258._8_8_ = local_370._M_dataplus._M_p;
          local_248._0_8_ = 10;
          local_248._8_8_ = "_Info.json";
          views_11._M_len = 2;
          views_11._M_array = (iterator)&local_258;
          cmCatViews_abi_cxx11_((string *)local_320,views_11);
          std::__cxx11::string::operator=(this_01,(string *)local_320);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_320 + 0x10)) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          }
          local_258._M_allocated_capacity = local_370._M_string_length;
          local_258._8_8_ = local_370._M_dataplus._M_p;
          local_248._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x5;
          local_248._8_8_ = "_Used";
          views_12._M_len = 2;
          views_12._M_array = (iterator)&local_258;
          cmCatViews_abi_cxx11_((string *)local_320,views_12);
          prefix_00._M_str = (char *)local_320._0_8_;
          prefix_00._M_len = local_320._8_8_;
          suffix_00._M_str = ".txt";
          suffix_00._M_len = 4;
          ConfigFileNames(this,(ConfigString *)(this_01 + 0x20),prefix_00,suffix_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_320 + 0x10)) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,
                            CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                     local_370.field_2._M_local_buf[0]) + 1);
          }
          pQVar39 = (pointer)(this_01 + 0xd0);
          this_01 = this_01 + 0x150;
        } while (pQVar39 != pQVar40);
        pQVar39 = (this->Rcc).Qrcs.
                  super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pQVar40 = (this->Rcc).Qrcs.
                  super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pQVar39 != pQVar40) {
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2c8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_350);
            local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
            pcVar11 = (pQVar39->QrcName)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_370,pcVar11,pcVar11 + (pQVar39->QrcName)._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_string_length !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              lVar30 = 0;
              do {
                if (local_370._M_dataplus._M_p[lVar30] == '-') {
                  local_370._M_dataplus._M_p[lVar30] = '_';
                }
                lVar30 = lVar30 + 1;
              } while (local_370._M_string_length != lVar30);
            }
            if (pQVar39->Unique == false) {
              local_258._M_allocated_capacity = 1;
              local_320._8_8_ = local_248;
              local_248[0] = 0x5f;
              local_320._24_8_ = (pQVar39->QrcPathChecksum)._M_dataplus._M_p;
              local_320._16_8_ = (pQVar39->QrcPathChecksum)._M_string_length;
              local_320._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x1;
              views_13._M_len = 2;
              views_13._M_array = (iterator)local_320;
              local_258._8_8_ = local_320._8_8_;
              cmCatViews_abi_cxx11_(&local_390,views_13);
              std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_390._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390._M_dataplus._M_p != &local_390.field_2) {
                operator_delete(local_390._M_dataplus._M_p,
                                local_390.field_2._M_allocated_capacity + 1);
              }
            }
            local_258._M_allocated_capacity = 0;
            local_258._8_8_ = 0;
            local_248._0_8_ = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[6]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_258._M_local_buf,(char (*) [6])0x7bc127);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_258._M_local_buf,&local_370);
            cmQtAutoGen::RccMergeOptions
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2c8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_258,4 < (uint)local_330);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_258);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p != &local_370.field_2) {
              operator_delete(local_370._M_dataplus._M_p,
                              CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                       local_370.field_2._M_local_buf[0]) + 1);
            }
            cmQtAutoGen::RccMergeOptions
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2c8,&pQVar39->Options,4 < (uint)local_330);
            local_248._0_8_ =
                 (pQVar39->Options).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pQVar39->Options).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2c8._16_8_;
            local_258._M_allocated_capacity =
                 (size_type)
                 (pQVar39->Options).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_258._8_8_ =
                 (pQVar39->Options).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (pQVar39->Options).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2c8._0_8_;
            (pQVar39->Options).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2c8._8_8_;
            local_2c8._0_8_ = (cmSourceFile *)0x0;
            local_2c8._8_8_ = (pointer)0x0;
            local_2c8._16_8_ = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_258);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2c8);
            pQVar39 = pQVar39 + 1;
          } while (pQVar39 != pQVar40);
          pQVar39 = (this->Rcc).Qrcs.
                    super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pQVar40 = (this->Rcc).Qrcs.
                    super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (pQVar39 != pQVar40) {
          files = &pQVar39->Resources;
          do {
            if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(files + -2))[1]._M_local_buf[0] == '\0') {
              local_320._0_8_ = local_320 + 0x10;
              local_320._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_320._16_8_ = local_320._16_8_ & 0xffffffffffffff00;
              pcVar11 = (this->Rcc).super_GenVarsT.Executable._M_dataplus._M_p;
              local_78._M_allocated_capacity = (size_type)&local_68;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_78,pcVar11,
                         pcVar11 + (this->Rcc).super_GenVarsT.Executable._M_string_length);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_48,
                       &((this->Rcc).super_GenVarsT.ExecutableFeatures.
                         super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->ListOptions);
              cmQtAutoGen::RccLister::RccLister
                        ((RccLister *)&local_258,(string *)&local_78,&local_48);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_48);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_allocated_capacity != &local_68) {
                operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68._0_8_ + 1));
              }
              bVar16 = cmQtAutoGen::RccLister::list
                                 ((RccLister *)&local_258,(string *)((long)(files + -0xc) + 8),files
                                  ,(string *)local_320,false);
              if (!bVar16) {
                cmSystemTools::Error((string *)local_320);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_238);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_allocated_capacity !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248) {
                  operator_delete((void *)local_258._M_allocated_capacity,
                                  (ulong)(local_248._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_320 + 0x10)) {
                  operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_350);
                return false;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_allocated_capacity !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248) {
                operator_delete((void *)local_258._M_allocated_capacity,(ulong)(local_248._0_8_ + 1)
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_320 + 0x10)) {
                operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
              }
            }
            pQVar39 = (pointer)(files + 1);
            files = files + 0xe;
          } while (pQVar39 != pQVar40);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_350);
  }
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitScanFiles()
{
  cmake const* cm = this->Makefile->GetCMakeInstance();
  auto const& kw = this->GlobalInitializer->kw();

  auto makeMUFile = [this, &kw](cmSourceFile* sf, std::string const& fullPath,
                                std::vector<size_t> const& configs,
                                bool muIt) -> MUFileHandle {
    MUFileHandle muf = cm::make_unique<MUFile>();
    muf->FullPath = fullPath;
    muf->SF = sf;
    if (!configs.empty() && configs.size() != this->ConfigsList.size()) {
      muf->Configs = configs;
    }
    muf->Generated = sf->GetIsGenerated();
    bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
    muf->SkipMoc = this->Moc.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOMOC));
    muf->SkipUic = this->Uic.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
    if (muIt) {
      muf->MocIt = this->Moc.Enabled && !muf->SkipMoc;
      muf->UicIt = this->Uic.Enabled && !muf->SkipUic;
    }
    return muf;
  };

  auto addMUHeader = [this](MUFileHandle&& muf, cm::string_view extension) {
    cmSourceFile* sf = muf->SF;
    const bool muIt = (muf->MocIt || muf->UicIt);
    if (this->CMP0100Accept || (extension != "hh")) {
      // Accept
      if (muIt && muf->Generated) {
        this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
      }
      this->AutogenTarget.Headers.emplace(sf, std::move(muf));
    } else if (muIt && this->CMP0100Warn) {
      // Store file for warning message
      this->AutogenTarget.CMP0100HeadersWarn.push_back(sf);
    }
  };

  auto addMUSource = [this](MUFileHandle&& muf) {
    if ((muf->MocIt || muf->UicIt) && muf->Generated) {
      this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
    }
    this->AutogenTarget.Sources.emplace(muf->SF, std::move(muf));
  };

  // Scan through target files
  {
    // Scan through target files
    for (cmGeneratorTarget::AllConfigSource const& acs :
         this->GenTarget->GetAllConfigSources()) {
      std::string const& fullPath = acs.Source->GetFullPath();
      std::string const& extLower =
        cmSystemTools::LowerCase(acs.Source->GetExtension());

      // Register files that will be scanned by moc or uic
      if (this->MocOrUicEnabled()) {
        if (cm->IsAHeaderExtension(extLower)) {
          addMUHeader(makeMUFile(acs.Source, fullPath, acs.Configs, true),
                      extLower);
        } else if (cm->IsACLikeSourceExtension(extLower)) {
          addMUSource(makeMUFile(acs.Source, fullPath, acs.Configs, true));
        }
      }

      // Register rcc enabled files
      if (this->Rcc.Enabled) {
        if ((extLower == kw.qrc) &&
            !acs.Source->GetPropertyAsBool(kw.SKIP_AUTOGEN) &&
            !acs.Source->GetPropertyAsBool(kw.SKIP_AUTORCC)) {
          // Register qrc file
          Qrc qrc;
          qrc.QrcFile = fullPath;
          qrc.QrcName =
            cmSystemTools::GetFilenameWithoutLastExtension(qrc.QrcFile);
          qrc.Generated = acs.Source->GetIsGenerated();
          // RCC options
          {
            std::string const& opts =
              acs.Source->GetSafeProperty(kw.AUTORCC_OPTIONS);
            if (!opts.empty()) {
              cmExpandList(opts, qrc.Options);
            }
          }
          this->Rcc.Qrcs.push_back(std::move(qrc));
        }
      }
    }
  }
  // cmGeneratorTarget::GetAllConfigSources computes the target's
  // sources meta data cache. Clear it so that OBJECT library targets that
  // are AUTOGEN initialized after this target get their added
  // mocs_compilation.cpp source acknowledged by this target.
  this->GenTarget->ClearSourcesCache();

  // For source files find additional headers and private headers
  if (this->MocOrUicEnabled()) {
    // Header search suffixes and extensions
    static std::initializer_list<cm::string_view> const suffixes{ "", "_p" };
    auto const& exts = cm->GetHeaderExtensions();
    // Scan through sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.MocIt || muf.UicIt) {
        // Search for the default header file and a private header
        std::string const& srcFullPath = muf.SF->ResolveFullPath();
        std::string basePath = cmStrCat(
          cmQtAutoGen::SubDirPrefix(srcFullPath),
          cmSystemTools::GetFilenameWithoutLastExtension(srcFullPath));
        for (auto const& suffix : suffixes) {
          std::string const suffixedPath = cmStrCat(basePath, suffix);
          for (auto const& ext : exts) {
            std::string fullPath = cmStrCat(suffixedPath, '.', ext);

            auto constexpr locationKind = cmSourceFileLocationKind::Known;
            cmSourceFile* sf =
              this->Makefile->GetSource(fullPath, locationKind);
            if (sf) {
              // Check if we know about this header already
              if (cm::contains(this->AutogenTarget.Headers, sf)) {
                continue;
              }
              // We only accept not-GENERATED files that do exist.
              if (!sf->GetIsGenerated() &&
                  !cmSystemTools::FileExists(fullPath)) {
                continue;
              }
            } else if (cmSystemTools::FileExists(fullPath)) {
              // Create a new source file for the existing file
              sf = this->Makefile->CreateSource(fullPath, false, locationKind);
            }

            if (sf) {
              auto eMuf = makeMUFile(sf, fullPath, muf.Configs, true);
              // Only process moc/uic when the parent is processed as well
              if (!muf.MocIt) {
                eMuf->MocIt = false;
              }
              if (!muf.UicIt) {
                eMuf->UicIt = false;
              }
              addMUHeader(std::move(eMuf), ext);
            }
          }
        }
      }
    }
  }

  // Scan through all source files in the makefile to extract moc and uic
  // parameters.  Historically we support non target source file parameters.
  // The reason is that their file names might be discovered from source files
  // at generation time.
  if (this->MocOrUicEnabled()) {
    for (const auto& sf : this->Makefile->GetSourceFiles()) {
      // sf->GetExtension() is only valid after sf->ResolveFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->ResolveFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& extLower =
        cmSystemTools::LowerCase(sf->GetExtension());

      if (cm->IsAHeaderExtension(extLower)) {
        if (!cm::contains(this->AutogenTarget.Headers, sf.get())) {
          auto muf = makeMUFile(sf.get(), fullPath, {}, false);
          if (muf->SkipMoc || muf->SkipUic) {
            addMUHeader(std::move(muf), extLower);
          }
        }
      } else if (cm->IsACLikeSourceExtension(extLower)) {
        if (!cm::contains(this->AutogenTarget.Sources, sf.get())) {
          auto muf = makeMUFile(sf.get(), fullPath, {}, false);
          if (muf->SkipMoc || muf->SkipUic) {
            addMUSource(std::move(muf));
          }
        }
      } else if (this->Uic.Enabled && (extLower == kw.ui)) {
        // .ui file
        bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
        bool const skipUic =
          (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
        if (!skipUic) {
          // Check if the .ui file has uic options
          std::string const uicOpts = sf->GetSafeProperty(kw.AUTOUIC_OPTIONS);
          if (uicOpts.empty()) {
            this->Uic.UiFilesNoOptions.emplace_back(fullPath);
          } else {
            this->Uic.UiFilesWithOptions.emplace_back(fullPath,
                                                      cmExpandedList(uicOpts));
          }

          auto uiHeaderRelativePath = cmSystemTools::RelativePath(
            this->LocalGen->GetCurrentSourceDirectory(),
            cmSystemTools::GetFilenamePath(fullPath));

          // Avoid creating a path containing adjacent slashes
          if (!uiHeaderRelativePath.empty() &&
              uiHeaderRelativePath.back() != '/') {
            uiHeaderRelativePath += '/';
          }

          auto uiHeaderFilePath = cmStrCat(
            '/', uiHeaderRelativePath, "ui_"_s,
            cmSystemTools::GetFilenameWithoutLastExtension(fullPath), ".h"_s);

          ConfigString uiHeader;
          std::string uiHeaderGenex;
          this->ConfigFileNamesAndGenex(
            uiHeader, uiHeaderGenex, cmStrCat(this->Dir.Build, "/include"_s),
            uiHeaderFilePath);

          this->Uic.UiHeaders.emplace_back(
            std::make_pair(uiHeader, uiHeaderGenex));
        } else {
          // Register skipped .ui file
          this->Uic.SkipUi.insert(fullPath);
        }
      }
    }
  }

  // Process GENERATED sources and headers
  if (this->MocOrUicEnabled() && !this->AutogenTarget.FilesGenerated.empty()) {
    if (this->CMP0071Accept) {
      // Let the autogen target depend on the GENERATED files
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        this->AutogenTarget.DependFiles.insert(muf->FullPath);
      }
    } else if (this->CMP0071Warn) {
      cm::string_view property;
      if (this->Moc.Enabled && this->Uic.Enabled) {
        property = "SKIP_AUTOGEN";
      } else if (this->Moc.Enabled) {
        property = "SKIP_AUTOMOC";
      } else if (this->Uic.Enabled) {
        property = "SKIP_AUTOUIC";
      }
      std::string files;
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        files += cmStrCat("  ", Quoted(muf->FullPath), '\n');
      }
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0071), '\n',
          "For compatibility, CMake is excluding the GENERATED source "
          "file(s):\n",
          files, "from processing by ",
          cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false),
          ".  If any of the files should be processed, set CMP0071 to NEW.  "
          "If any of the files should not be processed, "
          "explicitly exclude them by setting the source file property ",
          property, ":\n  set_property(SOURCE file.h PROPERTY ", property,
          " ON)\n"));
    }
  }

  // Generate CMP0100 warning
  if (this->MocOrUicEnabled() &&
      !this->AutogenTarget.CMP0100HeadersWarn.empty()) {
    cm::string_view property;
    if (this->Moc.Enabled && this->Uic.Enabled) {
      property = "SKIP_AUTOGEN";
    } else if (this->Moc.Enabled) {
      property = "SKIP_AUTOMOC";
    } else if (this->Uic.Enabled) {
      property = "SKIP_AUTOUIC";
    }
    std::string files;
    for (cmSourceFile* sf : this->AutogenTarget.CMP0100HeadersWarn) {
      files += cmStrCat("  ", Quoted(sf->GetFullPath()), '\n');
    }
    this->Makefile->IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0100), '\n',
        "For compatibility, CMake is excluding the header file(s):\n", files,
        "from processing by ",
        cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false),
        ".  If any of the files should be processed, set CMP0100 to NEW.  "
        "If any of the files should not be processed, "
        "explicitly exclude them by setting the source file property ",
        property, ":\n  set_property(SOURCE file.hh PROPERTY ", property,
        " ON)\n"));
  }

  // Process qrc files
  if (!this->Rcc.Qrcs.empty()) {
    const bool modernQt = (this->QtVersion.Major >= 5);
    // Target rcc options
    std::vector<std::string> optionsTarget =
      cmExpandedList(this->GenTarget->GetSafeProperty(kw.AUTORCC_OPTIONS));

    // Check if file name is unique
    for (Qrc& qrc : this->Rcc.Qrcs) {
      qrc.Unique = true;
      for (Qrc const& qrc2 : this->Rcc.Qrcs) {
        if ((&qrc != &qrc2) && (qrc.QrcName == qrc2.QrcName)) {
          qrc.Unique = false;
          break;
        }
      }
    }
    // Path checksum and file names
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Path checksum
      qrc.QrcPathChecksum = this->PathCheckSum.getPart(qrc.QrcFile);
      // Output file name
      qrc.OutputFile = cmStrCat(this->Dir.Build, '/', qrc.QrcPathChecksum,
                                "/qrc_", qrc.QrcName, ".cpp");
      std::string const base = cmStrCat(this->Dir.Info, "/AutoRcc_",
                                        qrc.QrcName, '_', qrc.QrcPathChecksum);
      qrc.LockFile = cmStrCat(base, "_Lock.lock");
      qrc.InfoFile = cmStrCat(base, "_Info.json");
      this->ConfigFileNames(qrc.SettingsFile, cmStrCat(base, "_Used"), ".txt");
    }
    // rcc options
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Target options
      std::vector<std::string> opts = optionsTarget;
      // Merge computed "-name XYZ" option
      {
        std::string name = qrc.QrcName;
        // Replace '-' with '_'. The former is not valid for symbol names.
        std::replace(name.begin(), name.end(), '-', '_');
        if (!qrc.Unique) {
          name += cmStrCat('_', qrc.QrcPathChecksum);
        }
        std::vector<std::string> nameOpts;
        nameOpts.emplace_back("-name");
        nameOpts.emplace_back(std::move(name));
        RccMergeOptions(opts, nameOpts, modernQt);
      }
      // Merge file option
      RccMergeOptions(opts, qrc.Options, modernQt);
      qrc.Options = std::move(opts);
    }
    // rcc resources
    for (Qrc& qrc : this->Rcc.Qrcs) {
      if (!qrc.Generated) {
        std::string error;
        RccLister const lister(this->Rcc.Executable,
                               this->Rcc.ExecutableFeatures->ListOptions);
        if (!lister.list(qrc.QrcFile, qrc.Resources, error)) {
          cmSystemTools::Error(error);
          return false;
        }
      }
    }
  }

  return true;
}